

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::error<unsigned_int_const&>
          (ValidationContext *this,IssueError *issue,uint *args)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args_00;
  allocator<char> local_81;
  undefined1 local_80 [40];
  string local_58;
  ulong local_38 [3];
  
  this->numError = this->numError + 1;
  this->returnCode = 3;
  local_80[0] = (issue->super_Issue).type;
  local_80._2_2_ = (issue->super_Issue).id;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)(local_80 + 8),&(issue->super_Issue).message,&local_81);
  local_38[0] = (ulong)*args;
  fmt.size_ = 2;
  fmt.data_ = (char *)(issue->super_Issue).detailsFmt._M_len;
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)local_38;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_58,(v10 *)(issue->super_Issue).detailsFmt._M_str,fmt,args_00);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            (&this->callback,(ValidationReport *)local_80);
  ValidationReport::~ValidationReport((ValidationReport *)local_80);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }